

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdline.h
# Opt level: O0

void __thiscall
cmdline::parser::option_with_value<short>::~option_with_value(option_with_value<short> *this)

{
  option_with_value<short> *this_local;
  
  (this->super_option_base)._vptr_option_base = (_func_int **)&PTR__option_with_value_001ccce8;
  std::__cxx11::string::~string((string *)&this->desc);
  std::__cxx11::string::~string((string *)&this->nam);
  option_base::~option_base(&this->super_option_base);
  return;
}

Assistant:

~option_with_value(){}